

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_digest.c
# Opt level: O0

void test_archive_rmd160(void)

{
  int iVar1;
  undefined8 local_48;
  uchar actualmd [21];
  undefined1 local_28 [8];
  uchar md [20];
  uchar buf [1];
  archive_rmd160_ctx ctx;
  
  memset(md + 0xf,0,1);
  local_48 = 0x1a22203493941bc8;
  actualmd[0] = 'z';
  actualmd[1] = 0xc0;
  actualmd[2] = '\x04';
  actualmd[3] = 0xa9;
  actualmd[4] = '\x02';
  actualmd[5] = 'B';
  actualmd[6] = 0xd8;
  actualmd[7] = 0xb1;
  actualmd[8] = 0xd3;
  actualmd[9] = 0xe5;
  actualmd[10] = '\a';
  actualmd[0xb] = '\r';
  actualmd[0xc] = '\0';
  iVar1 = __archive_ripemd160init((archive_rmd160_ctx *)(md + 0x10));
  if (iVar1 == 0) {
    iVar1 = __archive_ripemd160update((archive_rmd160_ctx *)(md + 0x10),md + 0xf,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                        ,L'>',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_rmd160_update(&ctx, buf, sizeof(buf))",(void *)0x0);
    iVar1 = __archive_ripemd160final((archive_rmd160_ctx *)(md + 0x10),local_28);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                        ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_rmd160_final(&ctx, md)",
                        (void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                        ,L'@',local_28,"md",&local_48,"actualmd",0x14,"sizeof(md)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_digest.c"
                   ,L';');
    test_skipping("This platform does not support RMD160");
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_rmd160)
{
	archive_rmd160_ctx ctx;
	unsigned char buf[] = "";
	unsigned char md[20];
	unsigned char actualmd[] = "\xc8\x1b\x94\x93\x34\x20\x22\x1a\x7a\xc0"
                             "\x04\xa9\x02\x42\xd8\xb1\xd3\xe5\x07\x0d";

	if (ARCHIVE_OK != archive_rmd160_init(&ctx)) {
		skipping("This platform does not support RMD160");
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_rmd160_update(&ctx, buf, sizeof(buf)));
	assertEqualInt(ARCHIVE_OK, archive_rmd160_final(&ctx, md));
	assertEqualMem(md, actualmd, sizeof(md));
}